

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O0

void __thiscall
QSharedMemorySystemV::updateNativeKeyFile(QSharedMemorySystemV *this,QNativeIpcKey *nativeKey)

{
  bool bVar1;
  long in_FS_OFFSET;
  QNativeIpcKey *in_stack_ffffffffffffff78;
  QByteArray *this_00;
  QByteArray local_50 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QNativeIpcKey::nativeKey(in_stack_ffffffffffffff78);
  bVar1 = QString::isEmpty((QString *)0x8d4429);
  QString::~QString((QString *)0x8d4439);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = local_50;
    QNativeIpcKey::nativeKey(in_stack_ffffffffffffff78);
    QFile::encodeName((QString *)in_stack_ffffffffffffff78);
    QByteArray::operator=(this_00,(QByteArray *)in_stack_ffffffffffffff78);
    QByteArray::~QByteArray((QByteArray *)0x8d4481);
    QString::~QString((QString *)0x8d448b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QSharedMemorySystemV::updateNativeKeyFile(const QNativeIpcKey &nativeKey)
{
    Q_ASSERT(nativeKeyFile.isEmpty() );
    if (!nativeKey.nativeKey().isEmpty())
        nativeKeyFile = QFile::encodeName(nativeKey.nativeKey());
}